

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O3

bool Diligent::VerifyBeginRenderPassAttribs(BeginRenderPassAttribs *Attribs)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  TextureFormatAttribs *pTVar5;
  char (*in_RCX) [35];
  char (*in_R9) [38];
  uint uVar6;
  ulong uVar7;
  long lVar8;
  Uint32 NumRequiredClearValues;
  string msg;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar9;
  string local_58;
  uint local_34;
  long lVar4;
  
  if (Attribs->pRenderPass == (IRenderPass *)0x0) {
    FormatString<char[40],char[35]>
              (&local_58,(Diligent *)"Begin render pass attribs are invalid: ",
               (char (*) [40])"pRenderPass pass must not be null.",in_RCX);
    in_RCX = (char (*) [35])0x145;
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"VerifyBeginRenderPassAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x145);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->pFramebuffer == (IFramebuffer *)0x0) {
    FormatString<char[40],char[31]>
              (&local_58,(Diligent *)"Begin render pass attribs are invalid: ",
               (char (*) [40])"pFramebuffer must not be null.",(char (*) [31])in_RCX);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"VerifyBeginRenderPassAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x146);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = (*(Attribs->pRenderPass->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  uVar9 = 0;
  if (*(int *)(lVar4 + 8) == 0) {
    uVar3 = Attribs->ClearValueCount;
  }
  else {
    uVar6 = 0;
    lVar8 = 5;
    uVar7 = 0;
    do {
      lVar1 = *(long *)(lVar4 + 0x10);
      if (*(char *)(lVar1 + -2 + lVar8) == '\x01') {
        uVar6 = (int)uVar7 + 1;
        uVar9 = uVar6;
      }
      pTVar5 = GetTextureFormatAttribs(*(TEXTURE_FORMAT *)(lVar1 + -5 + lVar8));
      if ((pTVar5->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) &&
         (*(char *)(lVar1 + lVar8) == '\x01')) {
        uVar6 = (int)uVar7 + 1;
        uVar9 = uVar6;
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < *(uint *)(lVar4 + 8));
    uVar3 = Attribs->ClearValueCount;
    if (uVar3 < uVar6) {
      in_R9 = (char (*) [38])&local_34;
      local_34 = uVar3;
      FormatString<char[40],char[10],unsigned_int,char[38],unsigned_int,char[15]>
                (&local_58,(Diligent *)"Begin render pass attribs are invalid: ",
                 (char (*) [40])0x753362,(char (*) [10])&stack0xffffffffffffffa4,
                 (uint *)" clear values are required, but only ",in_R9,(uint *)" are provided.",
                 (char (*) [15])CONCAT44(uVar9,in_stack_ffffffffffffffa0));
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"VerifyBeginRenderPassAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x15b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      uVar3 = Attribs->ClearValueCount;
    }
  }
  if ((uVar3 != 0) && (Attribs->pClearValues == (OptimizedClearValue *)0x0)) {
    FormatString<char[40],char[53],unsigned_int,char[15]>
              (&local_58,(Diligent *)"Begin render pass attribs are invalid: ",
               (char (*) [40])"pClearValues must not be null when ClearValueCount (",
               (char (*) [53])&Attribs->ClearValueCount,(uint *)") is not zero.",
               (char (*) [15])in_R9);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"VerifyBeginRenderPassAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x15d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return true;
}

Assistant:

bool VerifyBeginRenderPassAttribs(const BeginRenderPassAttribs& Attribs)
{
#define CHECK_BEGIN_RENDER_PASS_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Begin render pass attribs are invalid: ", __VA_ARGS__)

    CHECK_BEGIN_RENDER_PASS_ATTRIBS(Attribs.pRenderPass != nullptr, "pRenderPass pass must not be null.");
    CHECK_BEGIN_RENDER_PASS_ATTRIBS(Attribs.pFramebuffer != nullptr, "pFramebuffer must not be null.");

    const RenderPassDesc& RPDesc = Attribs.pRenderPass->GetDesc();

    Uint32 NumRequiredClearValues = 0;
    for (Uint32 i = 0; i < RPDesc.AttachmentCount; ++i)
    {
        const RenderPassAttachmentDesc& Attchmnt = RPDesc.pAttachments[i];
        if (Attchmnt.LoadOp == ATTACHMENT_LOAD_OP_CLEAR)
            NumRequiredClearValues = i + 1;

        const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Attchmnt.Format);
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
        {
            if (Attchmnt.StencilLoadOp == ATTACHMENT_LOAD_OP_CLEAR)
                NumRequiredClearValues = i + 1;
        }
    }

    CHECK_BEGIN_RENDER_PASS_ATTRIBS(Attribs.ClearValueCount >= NumRequiredClearValues,
                                    "at least ", NumRequiredClearValues, " clear values are required, but only ",
                                    Uint32{Attribs.ClearValueCount}, " are provided.");
    CHECK_BEGIN_RENDER_PASS_ATTRIBS(Attribs.ClearValueCount == 0 || Attribs.pClearValues != nullptr,
                                    "pClearValues must not be null when ClearValueCount (", Attribs.ClearValueCount, ") is not zero.");

#undef CHECK_BEGIN_RENDER_PASS_ATTRIBS

    return true;
}